

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9StripTagsFromString(jx9_context *pCtx,char *zIn,int nByte,char *zTaglist,int nTaglen)

{
  byte bVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  sxi32 sVar5;
  ushort **ppuVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  sxu32 sVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  int iVar15;
  byte *pbVar16;
  int iVar17;
  byte *pbVar18;
  byte *local_78;
  int local_70;
  long local_68;
  long local_60;
  SySet local_58;
  
  local_58.pAllocator = &pCtx->pVm->sAllocator;
  local_58.nUsed = 0;
  local_58.nSize = 0;
  local_58.eSize = 0x10;
  local_58.nCursor = 0;
  local_58.pBase = (void *)0x0;
  local_58.pUserData = (void *)0x0;
  if (nTaglen < 1) {
    sVar11 = 0;
  }
  else {
    pbVar16 = (byte *)(zTaglist + (uint)nTaglen);
    while (zTaglist < pbVar16) {
      bVar1 = *zTaglist;
      pbVar7 = (byte *)zTaglist;
      if (((0x3f < (ulong)bVar1) || ((0x9000a00200000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         ((0xbf < bVar1 ||
          (ppuVar6 = __ctype_b_loc(),
          (*(byte *)((long)*ppuVar6 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0)))) {
        while (pbVar7 < pbVar16) {
          bVar1 = *pbVar7;
          if ((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) {
            ppuVar6 = __ctype_b_loc();
            if (((*ppuVar6)[(char)bVar1] & 8) == 0) break;
            pbVar7 = pbVar7 + 1;
          }
          else {
            pbVar7 = pbVar7 + 1;
          }
        }
        uVar8 = (long)pbVar7 - (long)zTaglist;
        if (zTaglist <= pbVar7 && uVar8 != 0) {
          local_70 = (int)uVar8;
          uVar12 = uVar8 & 0xffffffff;
          pbVar18 = (byte *)zTaglist;
          local_78 = (byte *)zTaglist;
          while (((iVar17 = (int)uVar12, iVar17 != 0 &&
                  (bVar1 = *pbVar18, (ulong)(long)(char)bVar1 < 0xffffffffffffffc0)) &&
                 (ppuVar6 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar6 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0))) {
            pbVar18 = pbVar18 + 1;
            uVar12 = uVar12 - 1;
          }
          pbVar13 = (byte *)zTaglist + (uVar8 & 0xffffffff);
          uVar8 = 0;
          local_78 = pbVar18;
          local_70 = iVar17;
          do {
            pbVar13 = pbVar13 + -1;
            if (uVar12 == uVar8) {
              local_70 = 0;
              goto LAB_001303f6;
            }
            bVar1 = *pbVar13;
            if (0xffffffffffffffbf < (ulong)(long)(char)bVar1) {
              local_70 = iVar17 - (int)uVar8;
              goto LAB_001303f6;
            }
            ppuVar6 = __ctype_b_loc();
            uVar8 = uVar8 + 1;
          } while ((*(byte *)((long)*ppuVar6 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0);
          local_70 = (iVar17 - (int)uVar8) + 1;
LAB_001303f6:
          SySetPut(&local_58,&local_78);
        }
      }
      zTaglist = (char *)(pbVar7 + 1);
    }
    sVar11 = local_58.nUsed;
  }
  pvVar2 = local_58.pBase;
  pbVar16 = (byte *)(zIn + nByte);
  jx9_result_string(pCtx,"",0);
LAB_00130466:
  do {
    do {
      do {
        if (pbVar16 <= zIn) {
LAB_0013068f:
          sVar5 = SySetRelease(&local_58);
          return sVar5;
        }
        iVar17 = -(int)zIn;
        uVar8 = (ulong)zIn & 0xffffffff;
        lVar10 = 0;
        pbVar18 = (byte *)zIn;
        pbVar7 = (byte *)zIn;
        while( true ) {
          pbVar7 = pbVar7 + 1;
          pbVar13 = (byte *)zIn + lVar10;
          if (((pbVar16 <= pbVar13) || (*pbVar13 == 0)) || (*pbVar13 == 0x3c)) break;
          lVar10 = lVar10 + 1;
          iVar17 = iVar17 + -1;
          pbVar18 = pbVar18 + 1;
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        if (zIn < pbVar13) {
          jx9_result_string(pCtx,zIn,(int)lVar10);
        }
        while( true ) {
          if (pbVar16 <= pbVar13) goto LAB_0013068f;
          if (*pbVar13 != 0) break;
          pbVar13 = pbVar13 + 1;
          iVar17 = iVar17 + -1;
          pbVar18 = pbVar18 + 1;
          pbVar7 = pbVar7 + 1;
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        zIn = (char *)pbVar13;
      } while (*pbVar13 != 0x3c);
      do {
        pbVar14 = pbVar7;
        if (pbVar16 <= pbVar14) break;
        pbVar7 = pbVar14 + 1;
      } while (*pbVar14 != 0x3e);
      zIn = (char *)(pbVar14 + 1);
      if (pbVar16 <= pbVar14) {
        zIn = (char *)pbVar14;
      }
    } while (sVar11 == 0);
    local_68 = (long)zIn - (long)pbVar18;
    iVar3 = (int)zIn + iVar17;
    for (pbVar7 = pbVar13; pbVar18 = pbVar7, pbVar7 < pbVar13 + iVar3; pbVar7 = pbVar7 + 1) {
      bVar1 = *pbVar7;
      if ((0x3f < (ulong)bVar1) || ((0x9000800000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        if (0xbf < bVar1) break;
        local_60 = (long)(char)bVar1;
        ppuVar6 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar6 + local_60 * 2 + 1) & 0x20) == 0) break;
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      iVar17 = iVar17 + -1;
    }
LAB_0013058e:
    if (pbVar18 < pbVar13 + iVar3) {
      bVar1 = *pbVar18;
      if ((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) {
        ppuVar6 = __ctype_b_loc();
        if (((*ppuVar6)[(char)bVar1] & 8) == 0) goto LAB_001305e2;
        pbVar18 = pbVar18 + 1;
      }
      else {
        pbVar18 = pbVar18 + 1;
      }
      goto LAB_0013058e;
    }
LAB_001305e2:
    iVar17 = iVar17 + (int)pbVar18;
    for (lVar10 = 0; iVar3 = (int)lVar10, iVar17 != iVar3; lVar10 = lVar10 + 1) {
      bVar1 = pbVar7[lVar10];
      if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
         ((bVar1 != 0 &&
          (ppuVar6 = __ctype_b_loc(),
          (*(byte *)((long)*ppuVar6 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0)))) {
        iVar15 = ((int)uVar8 - (int)pbVar18) + iVar3;
        lVar9 = 0;
        goto LAB_0013063c;
      }
    }
  } while( true );
  while( true ) {
    iVar4 = *(int *)((long)pvVar2 + lVar9 + 8);
    if (iVar15 + iVar4 == 0) {
      iVar4 = SyStrnicmp(*(char **)((long)pvVar2 + lVar9),(char *)(pbVar7 + lVar10),iVar17 - iVar3);
    }
    else {
      iVar4 = iVar4 + iVar15;
    }
    lVar9 = lVar9 + 0x10;
    if (iVar4 == 0) break;
LAB_0013063c:
    if ((ulong)sVar11 * 0x10 + 0x10 == lVar9 + 0x10) goto LAB_00130466;
  }
  jx9_result_string(pCtx,(char *)pbVar13,(int)local_68);
  goto LAB_00130466;
}

Assistant:

JX9_PRIVATE sxi32 jx9StripTagsFromString(jx9_context *pCtx, const char *zIn, int nByte, const char *zTaglist, int nTaglen)
{
	const char *zEnd = &zIn[nByte];
	const char *zPtr, *zTag;
	SySet sSet;
	/* initialize the set of allowed tags */
	SySetInit(&sSet, &pCtx->pVm->sAllocator, sizeof(SyString));
	if( nTaglen > 0 ){
		/* Set of allowed tags */
		AddTag(&sSet, zTaglist, nTaglen);
	}
	/* Set the empty string */
	jx9_result_string(pCtx, "", 0);
	/* Start processing */
	for(;;){
		if(zIn >= zEnd){
			/* No more input to process */
			break;
		}
		zPtr = zIn;
		/* Find a tag */
		while( zIn < zEnd && zIn[0] != '<' && zIn[0] != 0 /* NUL byte */ ){
			zIn++;
		}
		if( zIn > zPtr ){
			/* Consume raw input */
			jx9_result_string(pCtx, zPtr, (int)(zIn-zPtr));
		}
		/* Ignore trailing null bytes */
		while( zIn < zEnd && zIn[0] == 0 ){
			zIn++;
		}
		if(zIn >= zEnd){
			/* No more input to process */
			break;
		}
		if( zIn[0] == '<' ){
			sxi32 rc;
			zTag = zIn++;
			/* Delimit the tag */
			while( zIn < zEnd && zIn[0] != '>' ){
				zIn++;
			}
			if( zIn < zEnd ){
				zIn++; /* Ignore the trailing closing tag */
			}
			/* Query the set */
			rc = FindTag(&sSet, zTag, (int)(zIn-zTag));
			if( rc == SXRET_OK ){
				/* Keep the tag */
				jx9_result_string(pCtx, zTag, (int)(zIn-zTag));
			}
		}
	}
	/* Cleanup */
	SySetRelease(&sSet);
	return SXRET_OK;
}